

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

bool QUtil::is_utf16(string *val)

{
  char *pcVar1;
  bool bVar2;
  
  if (val->_M_string_length < 2) {
    bVar2 = false;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)val);
    if ((*pcVar1 == -2) && (pcVar1 = (char *)std::__cxx11::string::at((ulong)val), *pcVar1 == -1)) {
      return true;
    }
    bVar2 = false;
    pcVar1 = (char *)std::__cxx11::string::at((ulong)val);
    if (*pcVar1 == -1) {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)val);
      bVar2 = *pcVar1 == -2;
    }
  }
  return bVar2;
}

Assistant:

bool
QUtil::is_utf16(std::string const& val)
{
    return (
        (val.length() >= 2) &&
        (((val.at(0) == '\xfe') && (val.at(1) == '\xff')) ||
         ((val.at(0) == '\xff') && (val.at(1) == '\xfe'))));
}